

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_tpl_varnames_h.cc
# Opt level: O3

string * Boilerplate(string *__return_storage_ptr__,string *progname,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *filenames)

{
  long *plVar1;
  string *extraout_RAX;
  string *psVar2;
  long *plVar3;
  size_type *psVar4;
  pointer pbVar5;
  long *plVar6;
  ulong uVar7;
  long lVar8;
  long *local_c0;
  long local_b0;
  long lStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  string *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  local_78 = progname;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"//\n","");
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pbVar5 = (filenames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((filenames->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      std::operator+(&local_a0,"//    ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar5->_M_dataplus)._M_p + lVar8));
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_a0);
      plVar3 = plVar1 + 2;
      if ((long *)*plVar1 == plVar3) {
        local_b0 = *plVar3;
        lStack_a8 = plVar1[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *plVar3;
        local_c0 = (long *)*plVar1;
      }
      *plVar1 = (long)plVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0);
      if (local_c0 != &local_b0) {
        operator_delete(local_c0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      uVar7 = uVar7 + 1;
      pbVar5 = (filenames->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x20;
    } while (uVar7 < (ulong)((long)(filenames->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5))
    ;
  }
  std::operator+(&local_50,"// by ",local_78);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar4 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_a0.field_2._M_allocated_capacity = *psVar4;
    local_a0.field_2._8_8_ = plVar1[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar4;
    local_a0._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_a0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_a0);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_b0 = *plVar3;
    lStack_a8 = plVar1[3];
    plVar6 = &local_b0;
  }
  else {
    local_b0 = *plVar3;
    plVar6 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)plVar6);
  if (plVar6 != &local_b0) {
    operator_delete(plVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  psVar2 = (string *)&local_50.field_2;
  if ((string *)local_50._M_dataplus._M_p != psVar2) {
    operator_delete(local_50._M_dataplus._M_p);
    psVar2 = extraout_RAX;
  }
  return psVar2;
}

Assistant:

static string Boilerplate(const string& progname,
                          const vector<string>& filenames) {
  string out(string("//\n"));
  if (filenames.size() > 1)
    out.append("// This header file auto-generated for the templates\n");
  else
    out.append("// This header file auto-generated for the template\n");

  for (vector<string>::size_type i = 0; i < filenames.size(); ++i)
    out.append("//    " + filenames[i] + "\n");

  out.append("// by " + progname + "\n" +
             "// DO NOT MODIFY THIS FILE DIRECTLY\n" +
             "//\n");
  return out;
}